

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall
Imath_3_1::Matrix33<float>::Matrix33
          (Matrix33<float> *this,float a,float b,float c,float d,float e,float f,float g,float h,
          float i)

{
  float h_local;
  float g_local;
  float f_local;
  float e_local;
  float d_local;
  float c_local;
  float b_local;
  float a_local;
  Matrix33<float> *this_local;
  
  this->x[0][0] = a;
  this->x[0][1] = b;
  this->x[0][2] = c;
  this->x[1][0] = d;
  this->x[1][1] = e;
  this->x[1][2] = f;
  this->x[2][0] = g;
  this->x[2][1] = h;
  this->x[2][2] = i;
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>::Matrix33 (T a, T b, T c, T d, T e, T f, T g, T h, T i) IMATH_NOEXCEPT
{
    x[0][0] = a;
    x[0][1] = b;
    x[0][2] = c;
    x[1][0] = d;
    x[1][1] = e;
    x[1][2] = f;
    x[2][0] = g;
    x[2][1] = h;
    x[2][2] = i;
}